

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O3

int forcingStep_AccessARKODEStepMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeForcingStepMem *step_mem)

{
  int line;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    line = 0x33;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    if (*(ARKodeForcingStepMem *)((long)arkode_mem + 0x88) != (ARKodeForcingStepMem)0x0) {
      *step_mem = *(ARKodeForcingStepMem *)((long)arkode_mem + 0x88);
      return 0;
    }
    fname = "forcingStep_AccessARKODEStepMem";
    msgfmt = "Time step module memory is NULL.";
    line = 0x20;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                  ,msgfmt);
  return -0x15;
}

Assistant:

static int forcingStep_AccessARKODEStepMem(void* arkode_mem, const char* fname,
                                           ARKodeMem* ark_mem,
                                           ARKodeForcingStepMem* step_mem)
{
  /* access ARKodeMem structure */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  *ark_mem = (ARKodeMem)arkode_mem;

  return forcingStep_AccessStepMem(*ark_mem, __func__, step_mem);
}